

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<unsigned_long,_false,_long>::BitpackingWriter::WriteConstant
               (unsigned_long constant,idx_t count,void *data_ptr,bool all_invalid)

{
  atomic<unsigned_long> *paVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  unsigned_long *puVar5;
  pointer pCVar6;
  bitpacking_metadata_encoded_t encoded_value;
  
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<unsigned_long,_false,_long> *)data_ptr,8,4);
  iVar2 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar4 = *(long *)((long)data_ptr + 0x48);
  iVar3 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar4 + -4;
  *(uint *)(lVar4 + -4) = iVar2 - iVar3 | 0x2000000;
  puVar5 = *(unsigned_long **)((long)data_ptr + 0x40);
  *puVar5 = constant;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar5 + 1;
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)((long)data_ptr + 0x20));
  LOCK();
  paVar1 = &(pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  return;
}

Assistant:

static void WriteConstant(T constant, idx_t count, void *data_ptr, bool all_invalid) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}